

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ClearOpsBufferStorageTestCase::execute
          (ClearOpsBufferStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  GLenum GVar1;
  uint uVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  uint local_424;
  uint local_3b4;
  char *local_3a8;
  char *local_3a0;
  uint local_398;
  uint local_394;
  MessageBuilder local_390;
  byte local_20e;
  byte local_20d;
  uint local_20c;
  uchar found_value_1;
  uint uStack_208;
  uchar expected_value_1;
  uint n_current_byte_1;
  uint modified_region_start_offset;
  uint modified_region_size;
  char *local_1f8;
  uint local_1ec;
  uint local_1e8 [4];
  MessageBuilder local_1d8;
  byte local_56;
  byte local_55;
  uint local_54;
  uchar found_value;
  uint uStack_50;
  uchar expected_value;
  uint current_initial_data_offset;
  uint n_current_byte;
  uint unmodified_region_start_offset;
  uint unmodified_region_size;
  bool result_local;
  uchar *result_data;
  uint local_30;
  uint clear_region_start_offset;
  uint clear_region_size;
  bool all_pages_committed;
  uint n_iteration;
  undefined4 uStack_1c;
  bool use_clear_buffer_data_call;
  uint n_clear_op_type;
  uint data_rgba8;
  bool result;
  ClearOpsBufferStorageTestCase *pCStack_10;
  GLuint sparse_bo_storage_flags_local;
  ClearOpsBufferStorageTestCase *this_local;
  
  n_clear_op_type._3_1_ = 1;
  uStack_1c = 0x12345678;
  n_iteration = 0;
  data_rgba8 = sparse_bo_storage_flags;
  pCStack_10 = this;
  do {
    if (1 < n_iteration) {
      return (bool)(n_clear_op_type._3_1_ & 1);
    }
    all_pages_committed = n_iteration == 0;
    for (clear_region_size = 0; clear_region_size < 2; clear_region_size = clear_region_size + 1) {
      clear_region_start_offset._3_1_ = clear_region_size == 0;
      if (!(bool)clear_region_start_offset._3_1_) {
        (*this->m_gl->bindBuffer)(0x8892,this->m_sparse_bo);
        GVar1 = (*this->m_gl->getError)();
        glu::checkError(GVar1,"glBindBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x678);
        (*this->m_gl->bufferPageCommitmentARB)
                  (0x8892,(ulong)(this->m_sparse_bo_size_rounded >> 1),
                   (ulong)(this->m_sparse_bo_size_rounded >> 1),'\x01');
        GVar1 = (*this->m_gl->getError)();
        glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x67d);
      }
      (*this->m_gl->bindBuffer)(0x8892,this->m_helper_bo);
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glBindBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x682);
      (*this->m_gl->bufferSubData)
                (0x8892,0,(ulong)this->m_sparse_bo_size_rounded,this->m_initial_data);
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glBufferSubData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x686);
      (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
      (*this->m_gl->bindBuffer)(0x8f37,this->m_sparse_bo);
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glBindBuffer() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x68a);
      (*this->m_gl->copyBufferSubData)(0x8f36,0x8f37,0,0,(ulong)this->m_sparse_bo_size_rounded);
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glCopyBufferSubData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x691);
      if ((all_pages_committed & 1U) == 0) {
        local_30 = this->m_sparse_bo_size_rounded >> 1;
        result_data._4_4_ = this->m_sparse_bo_size_rounded >> 1;
        (*this->m_gl->clearBufferSubData)
                  (0x8f37,0x8058,(ulong)result_data._4_4_,(ulong)local_30,0x1908,0x1401,
                   &stack0xffffffffffffffe4);
        GVar1 = (*this->m_gl->getError)();
        glu::checkError(GVar1,"glClearBufferSubData() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x6ab);
      }
      else {
        local_30 = this->m_sparse_bo_size_rounded;
        result_data._4_4_ = 0;
        (*this->m_gl->clearBufferData)(0x8f37,0x8058,0x1908,0x1401,&stack0xffffffffffffffe4);
        GVar1 = (*this->m_gl->getError)();
        glu::checkError(GVar1,"glClearBufferData() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x69f);
      }
      _unmodified_region_size = (void *)0x0;
      (*this->m_gl->copyBufferSubData)(0x8f37,0x8f36,0,0,(ulong)this->m_sparse_bo_size_rounded);
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glCopyBufferSubData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x6b6);
      _unmodified_region_size =
           (*this->m_gl->mapBufferRange)(0x8f36,0,(ulong)this->m_sparse_bo_size_rounded,1);
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glMapBufferRange() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x6bb);
      unmodified_region_start_offset._3_1_ = 1;
      if ((all_pages_committed & 1U) == 0) {
        local_3b4 = result_data._4_4_;
      }
      else {
        local_3b4 = 0;
      }
      n_current_byte = local_3b4;
      current_initial_data_offset = 0;
      for (uStack_50 = 0; uStack_50 < local_3b4; uStack_50 = uStack_50 + 1) {
        local_54 = uStack_50;
        local_55 = this->m_initial_data[uStack_50];
        local_56 = *(byte *)((long)_unmodified_region_size + (ulong)uStack_50);
        if (local_55 != local_56) {
          pTVar3 = tcu::TestContext::getLog(this->m_testCtx);
          tcu::TestLog::operator<<(&local_1d8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (&local_1d8,
                              (char (*) [69])
                              "Unmodified buffer object region has invalid contents. Expected byte "
                             );
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c3fdfc);
          local_1e8[0] = (uint)local_55;
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)local_1e8);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [16])"], found byte:[");
          local_1ec = (uint)local_56;
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)&local_1ec);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [13])"] at index [");
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&stack0xffffffffffffffb0);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [15])"]; call type:[");
          local_1f8 = "glClearBufferSubData()";
          if ((all_pages_committed & 1U) != 0) {
            local_1f8 = "glClearBufferData()";
          }
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1f8);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (pMVar4,(char (*) [35])"], all required pages committed?:[");
          _modified_region_start_offset = "no";
          if ((clear_region_start_offset._3_1_ & 1) != 0) {
            _modified_region_start_offset = "yes";
          }
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char **)&modified_region_start_offset);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29ea7ce);
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_1d8);
          unmodified_region_start_offset._3_1_ = 0;
          break;
        }
      }
      n_clear_op_type._3_1_ =
           (n_clear_op_type._3_1_ & 1 & unmodified_region_start_offset._3_1_) != 0;
      unmodified_region_start_offset._3_1_ = 1;
      if ((clear_region_start_offset._3_1_ & 1) == 0) {
        local_424 = 0;
      }
      else {
        local_424 = local_30;
      }
      n_current_byte_1 = local_424;
      uStack_208 = result_data._4_4_;
      for (local_20c = result_data._4_4_; local_20c < result_data._4_4_ + local_424;
          local_20c = local_20c + 1) {
        uVar2 = (0xff << ((byte)(local_20c << 3) & 0x1f) & 0x12345678U) >>
                ((byte)(local_20c << 3) & 0x1f);
        local_20d = (byte)uVar2;
        local_20e = *(byte *)((long)_unmodified_region_size + (ulong)local_20c);
        if ((uVar2 & 0xff) != (uint)local_20e) {
          pTVar3 = tcu::TestContext::getLog(this->m_testCtx);
          tcu::TestLog::operator<<(&local_390,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (&local_390,
                              (char (*) [69])
                              "Unmodified buffer object region has invalid contents. Expected byte "
                             );
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c3fdfc);
          local_394 = (uint)local_20d;
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)&local_394);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [16])"], found byte:[");
          local_398 = (uint)local_20e;
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)&local_398);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [13])"] at index [");
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_20c);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [15])"]; call type:[");
          local_3a0 = "glClearBufferSubData()";
          if ((all_pages_committed & 1U) != 0) {
            local_3a0 = "glClearBufferData()";
          }
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_3a0);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (pMVar4,(char (*) [35])"], all required pages committed?:[");
          local_3a8 = "no";
          if ((clear_region_start_offset._3_1_ & 1) != 0) {
            local_3a8 = "yes";
          }
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_3a8);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29ea7ce);
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_390);
          unmodified_region_start_offset._3_1_ = 0;
          break;
        }
      }
      n_clear_op_type._3_1_ =
           (n_clear_op_type._3_1_ & 1 & unmodified_region_start_offset._3_1_) != 0;
      (*this->m_gl->unmapBuffer)(0x8f36);
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glUnmapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x710);
    }
    n_iteration = n_iteration + 1;
  } while( true );
}

Assistant:

bool ClearOpsBufferStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	bool			   result	 = true;
	const unsigned int data_rgba8 = 0x12345678;

	for (unsigned int n_clear_op_type = 0; n_clear_op_type < 2; /* glClearBufferData(), glClearBufferSubData() */
		 ++n_clear_op_type)
	{
		const bool use_clear_buffer_data_call = (n_clear_op_type == 0);

		/* We will run the test case in two iterations:
		 *
		 * 1) All pages will have a physical backing.
		 * 2) Half of the pages will have a physical backing.
		 */
		for (unsigned int n_iteration = 0; n_iteration < 2; ++n_iteration)
		{
			/* By default, for each iteration all sparse buffer pages are commited.
			 *
			 * For the last iteration, we need to de-commit the latter half before
			 * proceeding with the test.
			 */
			const bool all_pages_committed = (n_iteration == 0);

			if (!all_pages_committed)
			{
				m_gl.bindBuffer(GL_ARRAY_BUFFER, m_sparse_bo);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

				m_gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, m_sparse_bo_size_rounded / 2, /* offset */
											 m_sparse_bo_size_rounded / 2,					/* size   */
											 GL_TRUE);										/* commit */
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");
			}

			/* Set up the sparse buffer contents */
			m_gl.bindBuffer(GL_ARRAY_BUFFER, m_helper_bo);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

			m_gl.bufferSubData(GL_ARRAY_BUFFER, 0, /* offset */
							   m_sparse_bo_size_rounded, m_initial_data);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferSubData() call failed.");

			m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
			m_gl.bindBuffer(GL_COPY_WRITE_BUFFER, m_sparse_bo);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call(s) failed.");

			m_gl.copyBufferSubData(GL_COPY_READ_BUFFER,  /* readTarget  */
								   GL_COPY_WRITE_BUFFER, /* writeTarget */
								   0,					 /* readOffset */
								   0,					 /* writeOffset */
								   m_sparse_bo_size_rounded);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

			/* Issue the clear call */
			unsigned int clear_region_size		   = 0;
			unsigned int clear_region_start_offset = 0;

			if (use_clear_buffer_data_call)
			{
				DE_ASSERT((m_sparse_bo_size_rounded % sizeof(unsigned int)) == 0);

				clear_region_size		  = m_sparse_bo_size_rounded;
				clear_region_start_offset = 0;

				m_gl.clearBufferData(GL_COPY_WRITE_BUFFER, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, &data_rgba8);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClearBufferData() call failed.");
			}
			else
			{
				DE_ASSERT(((m_sparse_bo_size_rounded / 2) % sizeof(unsigned int)) == 0);
				DE_ASSERT(((m_sparse_bo_size_rounded) % sizeof(unsigned int)) == 0);

				clear_region_size		  = m_sparse_bo_size_rounded / 2;
				clear_region_start_offset = m_sparse_bo_size_rounded / 2;

				m_gl.clearBufferSubData(GL_COPY_WRITE_BUFFER, GL_RGBA8, clear_region_start_offset, clear_region_size,
										GL_RGBA, GL_UNSIGNED_BYTE, &data_rgba8);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClearBufferSubData() call failed.");
			}

			/* Retrieve the modified buffer's contents */
			const unsigned char* result_data = NULL;

			m_gl.copyBufferSubData(GL_COPY_WRITE_BUFFER, /* readTarget  */
								   GL_COPY_READ_BUFFER,  /* writeTarget */
								   0,					 /* readOffset  */
								   0,					 /* writeOffset */
								   m_sparse_bo_size_rounded);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

			result_data = (unsigned char*)m_gl.mapBufferRange(GL_COPY_READ_BUFFER, 0, /* offset */
															  m_sparse_bo_size_rounded, GL_MAP_READ_BIT);

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glMapBufferRange() call failed.");

			/* Verify the result data: unmodified region */
			bool			   result_local			  = true;
			const unsigned int unmodified_region_size = (use_clear_buffer_data_call) ? 0 : clear_region_start_offset;
			const unsigned int unmodified_region_start_offset = 0;

			for (unsigned int n_current_byte = unmodified_region_start_offset;
				 (n_current_byte < unmodified_region_start_offset + unmodified_region_size) && result_local;
				 ++n_current_byte)
			{
				const unsigned int  current_initial_data_offset = n_current_byte - unmodified_region_start_offset;
				const unsigned char expected_value				= m_initial_data[current_initial_data_offset];
				const unsigned char found_value					= result_data[n_current_byte];

				if (expected_value != found_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Unmodified buffer object region has invalid contents. Expected byte "
									   << "[" << (int)expected_value << "]"
																		", found byte:"
																		"["
									   << (int)found_value << "]"
															  " at index "
															  "["
									   << n_current_byte << "]; "
															"call type:"
															"["
									   << ((use_clear_buffer_data_call) ? "glClearBufferData()" :
																		  "glClearBufferSubData()")
									   << "]"
										  ", all required pages committed?:"
										  "["
									   << ((all_pages_committed) ? "yes" : "no") << "]" << tcu::TestLog::EndMessage;

					result_local = false;
					break;
				}
			}

			result &= result_local;
			result_local = true;

			/* Verify the result data: modified region (clamped to the memory region
			 * with actual physical backing) */
			const unsigned int modified_region_size			= (all_pages_committed) ? clear_region_size : 0;
			const unsigned int modified_region_start_offset = clear_region_start_offset;

			for (unsigned int n_current_byte = modified_region_start_offset;
				 (n_current_byte < modified_region_start_offset + modified_region_size) && result_local;
				 ++n_current_byte)
			{
				const unsigned char expected_value =
					static_cast<unsigned char>((data_rgba8 & (0xFF << (n_current_byte * 8))) >> (n_current_byte * 8));
				const unsigned char found_value = result_data[n_current_byte];

				if (expected_value != found_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Unmodified buffer object region has invalid contents. Expected byte "
									   << "[" << (int)expected_value << "]"
																		", found byte:"
																		"["
									   << (int)found_value << "]"
															  " at index "
															  "["
									   << n_current_byte << "]; "
															"call type:"
															"["
									   << ((use_clear_buffer_data_call) ? "glClearBufferData()" :
																		  "glClearBufferSubData()")
									   << "]"
										  ", all required pages committed?:"
										  "["
									   << ((all_pages_committed) ? "yes" : "no") << "]" << tcu::TestLog::EndMessage;

					result_local = false;
					break;
				}
			}

			result &= result_local;

			/* Unmap the storage before proceeding */
			m_gl.unmapBuffer(GL_COPY_READ_BUFFER);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUnmapBuffer() call failed.");
		} /* for (both iterations) */
	}	 /* for (both clear types) */

	return result;
}